

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnImportGlobal
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index global_index,Type type,bool mutable_)

{
  ModuleDesc *pMVar1;
  Result RVar2;
  Enum EVar3;
  Location loc;
  GlobalType global_type;
  undefined1 local_e0 [8];
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  Location local_98;
  long *local_78 [2];
  long local_68 [2];
  _func_int **local_58;
  undefined1 local_48 [20];
  Mutability local_34;
  
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = (this->filename_)._M_len;
  local_98.filename._M_str = (this->filename_)._M_str;
  local_98.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar2 = SharedValidator::OnGlobalImport(&this->validator_,&local_98,type,mutable_);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    local_48._8_4_ = Global;
    local_48._0_8_ = &PTR__ExternType_0024b2e0;
    local_48._12_8_ = type;
    pMVar1 = this->module_;
    local_d8 = local_c8;
    local_34 = (uint)mutable_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,module_name._M_str,module_name._M_str + module_name._M_len);
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,field_name._M_str,field_name._M_str + field_name._M_len);
    GlobalType::Clone((GlobalType *)local_e0);
    local_98.filename._M_len = (size_t)&local_98.field_1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_d8,local_d0 + (long)local_d8);
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char*>((string *)local_78,local_b8,local_b0 + (long)local_b8)
    ;
    local_58 = (_func_int **)local_e0;
    local_e0 = (undefined1  [8])0x0;
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::
    emplace_back<wabt::interp::ImportDesc>(&pMVar1->imports,(ImportDesc *)&local_98);
    if (local_58 != (_func_int **)0x0) {
      (**(code **)(*local_58 + 8))();
    }
    local_58 = (_func_int **)0x0;
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_98.filename._M_len != &local_98.field_1) {
      operator_delete((void *)local_98.filename._M_len,(long)local_98.field_1.field_1.offset + 1);
    }
    if (local_e0 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_e0 + 8))();
    }
    local_e0 = (undefined1  [8])0x0;
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
    if (local_d8 != local_c8) {
      operator_delete(local_d8,local_c8[0] + 1);
    }
    std::vector<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>::push_back
              (&this->global_types_,(value_type *)local_48);
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnImportGlobal(Index import_index,
                                          std::string_view module_name,
                                          std::string_view field_name,
                                          Index global_index,
                                          Type type,
                                          bool mutable_) {
  CHECK_RESULT(validator_.OnGlobalImport(GetLocation(), type, mutable_));
  GlobalType global_type{type, ToMutability(mutable_)};
  module_.imports.push_back(ImportDesc{ImportType(
      std::string(module_name), std::string(field_name), global_type.Clone())});
  global_types_.push_back(global_type);
  return Result::Ok;
}